

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::
getConstraintsJacobianInfo
          (MultipleShootingTranscription *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nonZeroElementRows,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nonZeroElementColumns)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar4;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    iDynTree::reportError
              ("MultipleShootingTranscription","getConstraintsInfo",
               "First you need to call the prepare method");
    local_1 = false;
  }
  else {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    if (sVar2 != *(size_type *)(in_RDI + 0x288)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
    if (sVar2 != *(size_type *)(in_RDI + 0x288)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    for (uVar4 = 0; (ulong)uVar4 < *(ulong *)(in_RDI + 0x288); uVar4 = uVar4 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xf0),
                          (ulong)uVar4);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RSI,(ulong)uVar4);
      *pvVar3 = vVar1;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x108),
                          (ulong)uVar4);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,(ulong)uVar4);
      *pvVar3 = vVar1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

virtual bool getConstraintsJacobianInfo(std::vector<size_t>& nonZeroElementRows, std::vector<size_t>& nonZeroElementColumns) override {

                if (!(m_prepared)){
                    reportError("MultipleShootingTranscription", "getConstraintsInfo", "First you need to call the prepare method");
                    return false;
                }

                if (nonZeroElementRows.size() != m_jacobianNonZeros) {
                    nonZeroElementRows.resize(static_cast<unsigned int>(m_jacobianNonZeros));
                }

                if (nonZeroElementColumns.size() != m_jacobianNonZeros) {
                    nonZeroElementColumns.resize(static_cast<unsigned int>(m_jacobianNonZeros));
                }


                for (unsigned int i = 0; i < m_jacobianNonZeros; ++i){ //not the full vector of nonZeros should be read
                    nonZeroElementRows[i] = m_jacobianNZRows[i];
                    nonZeroElementColumns[i] = m_jacobianNZCols[i];
                }

                return true;
            }